

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

ActionMessage * __thiscall
helics::ActionMessage::operator=
          (ActionMessage *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  Message *pMVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->messageAction = cmd_send_message;
  pMVar1 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  this->messageID = pMVar1->messageID;
  this->flags = pMVar1->flags;
  SmallBuffer::operator=(&this->payload,&pMVar1->data);
  pMVar1 = (message->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  (this->actionTime).internalTimeCode = (pMVar1->time).internalTimeCode;
  std::__cxx11::string::string
            (&bStack_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pMVar1->dest);
  std::__cxx11::string::string
            (&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &((message->_M_t).
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->source);
  std::__cxx11::string::string
            (&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &((message->_M_t).
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->original_source);
  std::__cxx11::string::string
            (&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &((message->_M_t).
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->original_dest);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->stringData,
             &bStack_98,&stack0xffffffffffffffe8);
  lVar2 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&bStack_98._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return this;
}

Assistant:

ActionMessage& ActionMessage::operator=(std::unique_ptr<Message> message) noexcept
{
    messageAction = CMD_SEND_MESSAGE;
    messageID = message->messageID;
    flags = message->flags;
    payload = std::move(message->data);
    actionTime = message->time;
    stringData = {std::move(message->dest),
                  std::move(message->source),
                  std::move(message->original_source),
                  std::move(message->original_dest)};
    return *this;
}